

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O1

void __thiscall PKCS7Test_SortCerts_Test::TestBody(PKCS7Test_SortCerts_Test *this)

{
  int iVar1;
  X509 *new_cert1;
  X509 *new_cert2;
  X509 *new_cert3;
  pointer *__ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  char *in_R9;
  pointer *__ptr_2;
  AssertionResult gtest_ar_;
  UniquePtr<struct_stack_st_X509> certs;
  anon_class_16_2_66b45f4d check_order;
  string nss_p7c;
  CBS pkcs7;
  AssertHelper local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  undefined1 local_80 [16];
  undefined1 local_70 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  CBS local_30;
  
  GetTestData_abi_cxx11_((string *)&local_50,"crypto/pkcs7/test/nss.p7c");
  local_30.data = (uint8_t *)local_50._M_allocated_capacity;
  local_30.len = local_50._8_8_;
  local_80._0_8_ = OPENSSL_sk_new_null();
  local_90._M_head_impl._0_1_ = (OPENSSL_STACK *)local_80._0_8_ != (OPENSSL_STACK *)0x0;
  local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((OPENSSL_STACK *)local_80._0_8_ == (OPENSSL_STACK *)0x0) {
    testing::Message::Message((Message *)&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_70,(internal *)&local_90,(AssertionResult *)0x5cfb44,"false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(local_80 + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x126,(char *)local_70._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)(local_80 + 8),(Message *)&local_98);
LAB_00352029:
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_88;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(local_80 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._0_8_ != &local_60) {
      operator_delete((void *)local_70._0_8_,local_60._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,local_98.data_._0_4_) + 8))();
    }
    __ptr_00 = local_88;
    if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_003520de;
  }
  else {
    iVar1 = PKCS7_get_certificates((stack_st_X509 *)local_80._0_8_,&local_30);
    local_90._M_head_impl._0_1_ = iVar1 != 0;
    local_88 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_70,(internal *)&local_90,
                 (AssertionResult *)"PKCS7_get_certificates(certs.get(), &pkcs7)","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(local_80 + 8),kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
                 ,0x127,(char *)local_70._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)(local_80 + 8),(Message *)&local_98);
      goto LAB_00352029;
    }
    local_98.data_._0_4_ = 3;
    local_90._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         OPENSSL_sk_num((OPENSSL_STACK *)local_80._0_8_);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              ((internal *)local_70,"3u","sk_X509_num(certs.get())",(uint *)&local_98,
               (unsigned_long *)&local_90);
    if ((internal)local_70[0] != (internal)0x0) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._8_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)(local_70 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_70._8_8_);
      }
      new_cert1 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_80._0_8_,0);
      new_cert2 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_80._0_8_,1);
      new_cert3 = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)local_80._0_8_,2);
      local_70._8_8_ = local_80;
      local_70._0_8_ = &local_50;
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert1,new_cert2,new_cert3);
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert3,new_cert2,new_cert1);
      TestBody::anon_class_16_2_66b45f4d::operator()
                ((anon_class_16_2_66b45f4d *)local_70,new_cert2,new_cert3,new_cert1);
      goto LAB_003520de;
    }
    testing::Message::Message((Message *)&local_90);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_70._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs7/pkcs7_test.cc"
               ,0x128,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if (local_90._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_90._M_head_impl + 8))();
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._8_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) goto LAB_003520de;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(local_70 + 8);
    __ptr_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70._8_8_;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_003520de:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<stack_st_X509,_bssl::internal::Deleter> *)local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,local_40._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(PKCS7Test, SortCerts) {
  // nss.p7c contains three certificates in the canonical DER order.
  std::string nss_p7c = GetTestData("crypto/pkcs7/test/nss.p7c");
  CBS pkcs7 = bssl::StringAsBytes(nss_p7c);
  bssl::UniquePtr<STACK_OF(X509)> certs(sk_X509_new_null());
  ASSERT_TRUE(certs);
  ASSERT_TRUE(PKCS7_get_certificates(certs.get(), &pkcs7));
  ASSERT_EQ(3u, sk_X509_num(certs.get()));

  X509 *cert1 = sk_X509_value(certs.get(), 0);
  X509 *cert2 = sk_X509_value(certs.get(), 1);
  X509 *cert3 = sk_X509_value(certs.get(), 2);

  auto check_order = [&](X509 *new_cert1, X509 *new_cert2, X509 *new_cert3) {
    // Bundle the certificates in the new order.
    bssl::UniquePtr<STACK_OF(X509)> new_certs(sk_X509_new_null());
    ASSERT_TRUE(new_certs);
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert1)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert2)));
    ASSERT_TRUE(bssl::PushToStack(new_certs.get(), bssl::UpRef(new_cert3)));
    bssl::ScopedCBB cbb;
    ASSERT_TRUE(CBB_init(cbb.get(), nss_p7c.size()));
    ASSERT_TRUE(PKCS7_bundle_certificates(cbb.get(), new_certs.get()));

    // The bundle should be sorted back to the original order.
    CBS cbs;
    CBS_init(&cbs, CBB_data(cbb.get()), CBB_len(cbb.get()));
    bssl::UniquePtr<STACK_OF(X509)> result(sk_X509_new_null());
    ASSERT_TRUE(result);
    ASSERT_TRUE(PKCS7_get_certificates(result.get(), &cbs));
    ASSERT_EQ(sk_X509_num(certs.get()), sk_X509_num(result.get()));
    for (size_t i = 0; i < sk_X509_num(certs.get()); i++) {
      X509 *a = sk_X509_value(certs.get(), i);
      X509 *b = sk_X509_value(result.get(), i);
      EXPECT_EQ(0, X509_cmp(a, b));
    }
  };

  check_order(cert1, cert2, cert3);
  check_order(cert3, cert2, cert1);
  check_order(cert2, cert3, cert1);
}